

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::RemoveLast(RepeatedField<unsigned_int> *this)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_size;
  bool is_soo;
  RepeatedField<unsigned_int> *this_local;
  
  _old_size = this;
  absl_log_internal_check_op_result._7_1_ = RepeatedField<unsigned_int>::is_soo(this);
  absl_log_internal_check_op_result._0_4_ = size(this,(bool)absl_log_internal_check_op_result._7_1_)
  ;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                 ((int)absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GTImpl(v1,v2,"old_size > 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x3c6,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  elements(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  ExchangeCurrentSize(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1),
                      (int)absl_log_internal_check_op_result + -1);
  return;
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}